

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

sysbvm_tuple_t sysbvm_parser_parseSourceCode(sysbvm_context_t *context,sysbvm_tuple_t sourceCode)

{
  sysbvm_tuple_t sVar1;
  undefined1 local_50 [8];
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_24_3_72b1d4a0 gcFrame;
  sysbvm_tuple_t sourceCode_local;
  sysbvm_context_t *context_local;
  
  memset(&gcFrameRecord.roots,0,0x18);
  memset(local_50,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_JIT_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_50);
  gcFrameRecord.roots = (sysbvm_tuple_t *)sourceCode;
  sVar1 = sysbvm_scanner_scan(context,sourceCode);
  sVar1 = sysbvm_parser_parseTokens(context,(sysbvm_tuple_t)gcFrameRecord.roots,sVar1);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_50);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_parser_parseSourceCode(sysbvm_context_t *context, sysbvm_tuple_t sourceCode)
{
    struct {
        sysbvm_tuple_t sourceCode;
        sysbvm_tuple_t tokenSequence;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.sourceCode = sourceCode;
    gcFrame.tokenSequence = sysbvm_scanner_scan(context, gcFrame.sourceCode);
    gcFrame.result = sysbvm_parser_parseTokens(context, gcFrame.sourceCode, gcFrame.tokenSequence);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}